

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O0

void Vec_WecGrow(Vec_Wec_t *p,int nCapMin)

{
  Vec_Int_t *local_20;
  int nCapMin_local;
  Vec_Wec_t *p_local;
  
  if (p->nCap < nCapMin) {
    if (p->pArray == (Vec_Int_t *)0x0) {
      local_20 = (Vec_Int_t *)malloc((long)nCapMin << 4);
    }
    else {
      local_20 = (Vec_Int_t *)realloc(p->pArray,(long)nCapMin << 4);
    }
    p->pArray = local_20;
    memset(p->pArray + p->nCap,0,(long)(nCapMin - p->nCap) << 4);
    p->nCap = nCapMin;
  }
  return;
}

Assistant:

static inline void Vec_WecGrow( Vec_Wec_t * p, int nCapMin )
{
    if ( p->nCap >= nCapMin )
        return;
    p->pArray = ABC_REALLOC( Vec_Int_t, p->pArray, nCapMin ); 
    memset( p->pArray + p->nCap, 0, sizeof(Vec_Int_t) * (nCapMin - p->nCap) );
    p->nCap   = nCapMin;
}